

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Balance(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint fVerbose;
  uint fStrict;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_48 = 1000000000;
  local_4c = 0;
  fStrict = 0;
  fVerbose = 0;
  local_44 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                iVar2 = Extra_UtilGetopt(argc,argv,"Ndaslvwh");
                iVar5 = globalUtilOptind;
              } while (iVar2 == 0x6c);
              if (iVar2 == -1) {
                pGVar3 = pAbc->pGia;
                if (pGVar3 != (Gia_Man_t *)0x0) {
                  if (bVar1) {
                    pGVar3 = Gia_ManBalance(pGVar3,local_4c,fStrict,fVerbose);
                  }
                  else {
                    pGVar3 = Gia_ManAreaBalance(pGVar3,local_4c,local_48,fVerbose,local_44);
                  }
                  Abc_FrameUpdateGia(pAbc,pGVar3);
                  return 0;
                }
                pcVar4 = "Abc_CommandAbc9Balance(): There is no AIG.\n";
                iVar5 = -1;
                goto LAB_00216fff;
              }
              if (iVar2 != 0x77) break;
              local_44 = local_44 ^ 1;
            }
            if (iVar2 != 0x61) break;
            local_4c = local_4c ^ 1;
          }
          if (iVar2 != 100) break;
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (iVar2 != 0x73) break;
        fStrict = fStrict ^ 1;
      }
      if (iVar2 != 0x76) break;
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 != 0x4e) goto LAB_00216f27;
    if (argc <= globalUtilOptind) break;
    local_48 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_48 < 0) {
LAB_00216f27:
      iVar5 = -2;
      Abc_Print(-2,"usage: &b [-N num] [-dasvwh]\n");
      Abc_Print(-2,"\t         performs AIG balancing to reduce delay and area\n");
      Abc_Print(-2,"\t-N num : the max fanout count to skip a divisor [default = %d]\n",
                (ulong)local_48);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle delay only balancing [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fStrict == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (local_44 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_00216fff:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by a char string.\n");
  goto LAB_00216f27;
}

Assistant:

int Abc_CommandAbc9Balance( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int nNewNodesMax = ABC_INFINITY;
    int fDelayOnly   = 0;
    int fSimpleAnd   = 0;
    int fStrict      = 0;
    int fKeepLevel   = 0;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ndaslvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a char string.\n" );
                goto usage;
            }
            nNewNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNewNodesMax < 0 )
                goto usage;
            break;
        case 'd':
            fDelayOnly ^= 1;
            break;
        case 'a':
            fSimpleAnd ^= 1;
            break;
        case 's':
            fStrict ^= 1;
            break;
        case 'l':
            fKeepLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Balance(): There is no AIG.\n" );
        return 1;
    }
    if ( fDelayOnly )
        pTemp = Gia_ManBalance( pAbc->pGia, fSimpleAnd, fStrict, fVerbose );
    else
        pTemp = Gia_ManAreaBalance( pAbc->pGia, fSimpleAnd, nNewNodesMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &b [-N num] [-dasvwh]\n" );
    Abc_Print( -2, "\t         performs AIG balancing to reduce delay and area\n" );
    Abc_Print( -2, "\t-N num : the max fanout count to skip a divisor [default = %d]\n", nNewNodesMax );
    Abc_Print( -2, "\t-d     : toggle delay only balancing [default = %s]\n", fDelayOnly? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n", fSimpleAnd? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n", fStrict? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}